

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::has_element(raw_hash_set<phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  ctrl_t *pcVar2;
  ulong uVar3;
  slot_type *pptVar4;
  pointer __s2;
  size_t sVar5;
  size_t __n;
  uint uVar6;
  ushort uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  int iVar24;
  uint uVar25;
  byte unaff_BPL;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  __m128i match;
  ulong local_78;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  
  pcVar2 = this->ctrl_;
  if (pcVar2 == (ctrl_t *)0x0) {
    unaff_BPL = 0;
  }
  else {
    uVar3 = this->capacity_;
    if ((uVar3 + 1 & uVar3) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar26 = hashval >> 7 & uVar3;
    auVar29 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar29 = pshuflw(auVar29,auVar29,0);
    pptVar4 = this->slots_;
    __s2 = (elem->_M_dataplus)._M_p;
    sVar5 = elem->_M_string_length;
    local_78 = 0;
    do {
      pcVar1 = pcVar2 + uVar26;
      cVar8 = *pcVar1;
      cVar9 = pcVar1[1];
      cVar10 = pcVar1[2];
      cVar11 = pcVar1[3];
      cVar12 = pcVar1[4];
      cVar13 = pcVar1[5];
      cVar14 = pcVar1[6];
      cVar15 = pcVar1[7];
      cVar16 = pcVar1[8];
      cVar17 = pcVar1[9];
      cVar18 = pcVar1[10];
      cVar19 = pcVar1[0xb];
      cVar20 = pcVar1[0xc];
      cVar21 = pcVar1[0xd];
      cVar22 = pcVar1[0xe];
      cVar23 = pcVar1[0xf];
      local_58 = auVar29[0];
      cStack_57 = auVar29[1];
      cStack_56 = auVar29[2];
      cStack_55 = auVar29[3];
      auVar30[0] = -(local_58 == cVar8);
      auVar30[1] = -(cStack_57 == cVar9);
      auVar30[2] = -(cStack_56 == cVar10);
      auVar30[3] = -(cStack_55 == cVar11);
      auVar30[4] = -(local_58 == cVar12);
      auVar30[5] = -(cStack_57 == cVar13);
      auVar30[6] = -(cStack_56 == cVar14);
      auVar30[7] = -(cStack_55 == cVar15);
      auVar30[8] = -(local_58 == cVar16);
      auVar30[9] = -(cStack_57 == cVar17);
      auVar30[10] = -(cStack_56 == cVar18);
      auVar30[0xb] = -(cStack_55 == cVar19);
      auVar30[0xc] = -(local_58 == cVar20);
      auVar30[0xd] = -(cStack_57 == cVar21);
      auVar30[0xe] = -(cStack_56 == cVar22);
      auVar30[0xf] = -(cStack_55 == cVar23);
      uVar7 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf;
      bVar27 = uVar7 == 0;
      if (!bVar27) {
        uVar25 = (uint)uVar7;
        do {
          uVar6 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          __n = pptVar4[uVar6 + uVar26 & uVar3]->_M_string_length;
          if (__n == sVar5) {
            if (__n == 0) {
              bVar28 = true;
            }
            else {
              iVar24 = bcmp((pptVar4[uVar6 + uVar26 & uVar3]->_M_dataplus)._M_p,__s2,__n);
              bVar28 = iVar24 == 0;
            }
          }
          else {
            bVar28 = false;
          }
          unaff_BPL = unaff_BPL | bVar28;
          if (bVar28 != false) break;
          uVar25 = uVar25 - 1 & uVar25;
          bVar27 = uVar25 == 0;
        } while (!bVar27);
      }
      if (bVar27) {
        auVar31[0] = -(cVar8 == -0x80);
        auVar31[1] = -(cVar9 == -0x80);
        auVar31[2] = -(cVar10 == -0x80);
        auVar31[3] = -(cVar11 == -0x80);
        auVar31[4] = -(cVar12 == -0x80);
        auVar31[5] = -(cVar13 == -0x80);
        auVar31[6] = -(cVar14 == -0x80);
        auVar31[7] = -(cVar15 == -0x80);
        auVar31[8] = -(cVar16 == -0x80);
        auVar31[9] = -(cVar17 == -0x80);
        auVar31[10] = -(cVar18 == -0x80);
        auVar31[0xb] = -(cVar19 == -0x80);
        auVar31[0xc] = -(cVar20 == -0x80);
        auVar31[0xd] = -(cVar21 == -0x80);
        auVar31[0xe] = -(cVar22 == -0x80);
        auVar31[0xf] = -(cVar23 == -0x80);
        if ((((((((((((((((auVar31 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar31 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar31 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar31 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar31 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar31 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar31 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar31 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar31 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar31 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar31 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar31 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar31 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar31 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar31 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar31[0xf]
           ) {
          if (uVar3 <= local_78 + 0x10) {
            __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x87c,
                          "bool phmap::priv::raw_hash_set<phmap::priv::NodeHashSetPolicy<std::basic_string<char>>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::basic_string<char>>>::has_element(const value_type &__restrict, size_t) const [Policy = phmap::priv::NodeHashSetPolicy<std::basic_string<char>>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::basic_string<char>>]"
                         );
          }
          uVar26 = uVar26 + local_78 + 0x10 & uVar3;
          bVar27 = true;
          local_78 = local_78 + 0x10;
        }
        else {
          bVar27 = false;
          unaff_BPL = 0;
        }
      }
      else {
        bVar27 = false;
      }
    } while (bVar27);
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool has_element(const value_type& PHMAP_RESTRICT elem, size_t hashval) const {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
                                      elem))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
            seq.next();
            assert(seq.getindex() < capacity_ && "full table!");
        }
        return false;
    }